

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
UntypedPerformAction
          (FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
           *this,void *untyped_action,void *untyped_args)

{
  linked_ptr_internal lVar1;
  ActionResultHolder<TestFunction> *pAVar2;
  Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> action;
  linked_ptr<testing::ActionInterface<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>_>
  local_18;
  
  local_18.value_ = *untyped_action;
  lVar1.next_ = &local_18.link_;
  if (local_18.value_ !=
      (ActionInterface<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)0x0) {
    linked_ptr_internal::join(&local_18.link_,(linked_ptr_internal *)((long)untyped_action + 8));
    lVar1.next_ = local_18.link_.next_;
  }
  local_18.link_.next_ = lVar1.next_;
  pAVar2 = ActionResultHolder<TestFunction>::
           PerformAction<TestFunction(int,fmt::BasicStringRef<char>,int,mp::func::Type)>
                     ((Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)
                      &local_18,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>_>
  ::~linked_ptr(&local_18);
  return &pAVar2->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }